

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_init_stream(archive_write_filter *f,private_data_conflict7 *data)

{
  uint uVar1;
  uint local_b8;
  int local_b4;
  int wedges;
  int log2dic;
  int ds;
  int dict_size;
  lzma_mt mt_options;
  int ret;
  private_data_conflict7 *data_local;
  archive_write_filter *f_local;
  
  memcpy(&data->stream,&archive_compressor_xz_init_stream::lzma_stream_init_data,0x88);
  (data->stream).next_out = data->compressed;
  (data->stream).avail_out = data->compressed_buffer_size;
  if (f->code == 6) {
    if (data->threads == 1) {
      mt_options.reserved_ptr4._4_4_ =
           lzma_stream_encoder(&data->stream,data->lzmafilters,LZMA_CHECK_CRC64);
    }
    else {
      memset(&ds,0,0x80);
      dict_size = data->threads;
      mt_options.block_size._0_4_ = 300;
      mt_options._16_8_ = data->lzmafilters;
      mt_options.filters._0_4_ = 4;
      mt_options.reserved_ptr4._4_4_ = lzma_stream_encoder_mt(&data->stream,(lzma_mt *)&ds);
    }
  }
  else if (f->code == 5) {
    mt_options.reserved_ptr4._4_4_ = lzma_alone_encoder(&data->stream,&data->lzma_opt);
  }
  else {
    uVar1 = (data->lzma_opt).dict_size;
    if (((int)uVar1 < 0x1000) || (0x20000000 < (int)uVar1)) {
      archive_set_error(f->archive,-1,"Unacceptable dictionary size for lzip: %d",(ulong)uVar1);
      return -0x1e;
    }
    local_b4 = 0x1d;
    while ((0xb < local_b4 && ((uVar1 & 1 << ((byte)local_b4 & 0x1f)) == 0))) {
      local_b4 = local_b4 + -1;
    }
    if (1 << ((byte)local_b4 & 0x1f) < (int)uVar1) {
      local_b4 = local_b4 + 1;
      local_b8 = (int)((1 << ((byte)local_b4 & 0x1f)) - uVar1) / (1 << ((byte)local_b4 - 4 & 0x1f));
    }
    else {
      local_b8 = 0;
    }
    data->crc32 = 0;
    *data->compressed = 'L';
    data->compressed[1] = 'Z';
    data->compressed[2] = 'I';
    data->compressed[3] = 'P';
    data->compressed[4] = '\x01';
    data->compressed[5] = (byte)((local_b8 & 7) << 5) | (byte)local_b4 & 0x1f;
    (data->stream).next_out = (data->stream).next_out + 6;
    (data->stream).avail_out = (data->stream).avail_out - 6;
    mt_options.reserved_ptr4._4_4_ = lzma_raw_encoder(&data->stream,data->lzmafilters);
  }
  if (mt_options.reserved_ptr4._4_4_ == LZMA_OK) {
    f_local._4_4_ = 0;
  }
  else {
    if (mt_options.reserved_ptr4._4_4_ == LZMA_MEM_ERROR) {
      archive_set_error(f->archive,0xc,
                        "Internal error initializing compression library: Cannot allocate memory");
    }
    else {
      archive_set_error(f->archive,-1,
                        "Internal error initializing compression library: It\'s a bug in liblzma");
    }
    f_local._4_4_ = -0x1e;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_xz_init_stream(struct archive_write_filter *f,
    struct private_data *data)
{
	static const lzma_stream lzma_stream_init_data = LZMA_STREAM_INIT;
	int ret;
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
	lzma_mt mt_options;
#endif

	data->stream = lzma_stream_init_data;
	data->stream.next_out = data->compressed;
	data->stream.avail_out = data->compressed_buffer_size;
	if (f->code == ARCHIVE_FILTER_XZ) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
		if (data->threads != 1) {
			memset(&mt_options, 0, sizeof(mt_options));
			mt_options.threads = data->threads;
			mt_options.timeout = 300;
			mt_options.filters = data->lzmafilters;
			mt_options.check = LZMA_CHECK_CRC64;
			ret = lzma_stream_encoder_mt(&(data->stream),
			    &mt_options);
		} else
#endif
			ret = lzma_stream_encoder(&(data->stream),
			    data->lzmafilters, LZMA_CHECK_CRC64);
	} else if (f->code == ARCHIVE_FILTER_LZMA) {
		ret = lzma_alone_encoder(&(data->stream), &data->lzma_opt);
	} else {	/* ARCHIVE_FILTER_LZIP */
		int dict_size = data->lzma_opt.dict_size;
		int ds, log2dic, wedges;

		/* Calculate a coded dictionary size */
		if (dict_size < (1 << 12) || dict_size > (1 << 29)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Unacceptable dictionary size for lzip: %d",
			    dict_size);
			return (ARCHIVE_FATAL);
		}
		for (log2dic = 29; log2dic >= 12; log2dic--) {
			if (dict_size & (1 << log2dic))
				break;
		}
		if (dict_size > (1 << log2dic)) {
			log2dic++;
			wedges =
			    ((1 << log2dic) - dict_size) / (1 << (log2dic - 4));
		} else
			wedges = 0;
		ds = ((wedges << 5) & 0xe0) | (log2dic & 0x1f);

		data->crc32 = 0;
		/* Make a header */
		data->compressed[0] = 0x4C;
		data->compressed[1] = 0x5A;
		data->compressed[2] = 0x49;
		data->compressed[3] = 0x50;
		data->compressed[4] = 1;/* Version */
		data->compressed[5] = (unsigned char)ds;
		data->stream.next_out += 6;
		data->stream.avail_out -= 6;

		ret = lzma_raw_encoder(&(data->stream), data->lzmafilters);
	}
	if (ret == LZMA_OK)
		return (ARCHIVE_OK);

	switch (ret) {
	case LZMA_MEM_ERROR:
		archive_set_error(f->archive, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		break;
	default:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		break;
	}
	return (ARCHIVE_FATAL);
}